

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall
llvm::raw_fd_ostream::raw_fd_ostream(raw_fd_ostream *this,StringRef Filename,error_code *EC)

{
  error_code *EC_local;
  raw_fd_ostream *this_local;
  StringRef Filename_local;
  
  raw_fd_ostream(this,Filename,EC,CD_CreateAlways,FA_Write,F_None);
  return;
}

Assistant:

raw_fd_ostream::raw_fd_ostream(StringRef Filename, std::error_code &EC)
    : raw_fd_ostream(Filename, EC, sys::fs::CD_CreateAlways, sys::fs::FA_Write,
                     sys::fs::OF_None) {}